

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<spirv_cross::EntryPoint,_8UL>::push_back
          (SmallVector<spirv_cross::EntryPoint,_8UL> *this,EntryPoint *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  EntryPoint *pEVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  EntryPoint *pEVar5;
  size_t sVar6;
  pointer pcVar7;
  size_type sVar8;
  
  reserve(this,(this->super_VectorView<spirv_cross::EntryPoint>).buffer_size + 1);
  pEVar5 = (this->super_VectorView<spirv_cross::EntryPoint>).ptr;
  sVar6 = (this->super_VectorView<spirv_cross::EntryPoint>).buffer_size;
  pEVar3 = pEVar5 + sVar6;
  paVar4 = &pEVar5[sVar6].name.field_2;
  (&paVar4->_M_allocated_capacity)[-2] = (size_type)paVar4;
  pcVar7 = (t->name)._M_dataplus._M_p;
  paVar1 = &(t->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar7 == paVar1) {
    sVar8 = *(size_type *)((long)&(t->name).field_2 + 8);
    paVar4->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    (&paVar4->_M_allocated_capacity)[1] = sVar8;
  }
  else {
    (pEVar3->name)._M_dataplus._M_p = pcVar7;
    (pEVar3->name).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (pEVar3->name)._M_string_length = (t->name)._M_string_length;
  (t->name)._M_dataplus._M_p = (pointer)paVar1;
  (t->name)._M_string_length = 0;
  (t->name).field_2._M_local_buf[0] = '\0';
  pEVar3->execution_model = t->execution_model;
  psVar2 = &(this->super_VectorView<spirv_cross::EntryPoint>).buffer_size;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}